

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

int Dtc_ManCutMergeOne(int *pCut0,int *pCut1,int *pCut)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (-1 < *pCut1) {
    lVar2 = -1;
    do {
      pCut[lVar2 + 1] = pCut1[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (lVar2 < *pCut1);
  }
  iVar3 = *pCut0;
  if (0 < iVar3) {
    lVar2 = 1;
    do {
      if (0 < *pCut1) {
        lVar7 = 1;
        do {
          if (pCut0[lVar2] == pCut1[lVar7]) goto LAB_00672893;
          lVar7 = lVar7 + 1;
        } while ((ulong)(uint)*pCut1 + 1 != lVar7);
      }
      iVar3 = *pCut;
      if ((long)iVar3 == 3) {
        return 0;
      }
      iVar6 = pCut0[lVar2];
      *pCut = iVar3 + 1;
      pCut[(long)iVar3 + 1] = iVar6;
      iVar3 = *pCut0;
LAB_00672893:
      bVar1 = lVar2 < iVar3;
      lVar2 = lVar2 + 1;
    } while (bVar1);
  }
  if ((*pCut & 0xfffffffeU) != 2) {
    __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xcb,"int Dtc_ManCutMergeOne(int *, int *, int *)");
  }
  iVar3 = pCut[1];
  iVar6 = pCut[2];
  iVar4 = iVar3;
  if (iVar6 < iVar3) {
    pCut[1] = iVar6;
    pCut[2] = iVar3;
    iVar4 = iVar6;
    iVar6 = iVar3;
  }
  if (iVar4 < iVar6) {
    if (*pCut != 2) {
      iVar3 = pCut[3];
      iVar5 = iVar6;
      if (iVar3 < iVar6) {
        pCut[2] = iVar3;
        pCut[3] = iVar6;
        iVar5 = iVar3;
        iVar3 = iVar6;
      }
      iVar6 = iVar4;
      if (iVar5 < iVar4) {
        pCut[1] = iVar5;
        pCut[2] = iVar4;
        iVar6 = iVar5;
        iVar5 = iVar4;
      }
      if (iVar5 <= iVar6) {
        __assert_fail("pCut[1] < pCut[2]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0xd5,"int Dtc_ManCutMergeOne(int *, int *, int *)");
      }
      if (iVar3 <= iVar5) {
        __assert_fail("pCut[2] < pCut[3]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0xd6,"int Dtc_ManCutMergeOne(int *, int *, int *)");
      }
    }
    return 1;
  }
  __assert_fail("pCut[1] < pCut[2]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0xce,"int Dtc_ManCutMergeOne(int *, int *, int *)");
}

Assistant:

int Dtc_ManCutMergeOne( int * pCut0, int * pCut1, int * pCut )
{
    int i, k;
    for ( k = 0; k <= pCut1[0]; k++ )
        pCut[k] = pCut1[k];
    for ( i = 1; i <= pCut0[0]; i++ )
    {
        for ( k = 1; k <= pCut1[0]; k++ )
            if ( pCut0[i] == pCut1[k] )
                break;
        if ( k <= pCut1[0] )
            continue;
        if ( pCut[0] == 3 )
            return 0;
        pCut[1+pCut[0]++] = pCut0[i];
    }
    assert( pCut[0] == 2 || pCut[0] == 3 );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    if ( pCut[0] == 2 )
        return 1;
    if ( pCut[2] > pCut[3] )
        ABC_SWAP( int, pCut[2], pCut[3] );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    assert( pCut[2] < pCut[3] );
    return 1;
}